

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O1

void __thiscall
GdlGlyphClassDefn::FlattenGlyphList
          (GdlGlyphClassDefn *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vgidFlattened)

{
  iterator __position;
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->m_fHasFlatList == false) {
    FlattenMyGlyphList(this);
  }
  puVar1 = (this->m_vgidFlattened).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vgidFlattened).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      __position._M_current =
           (vgidFlattened->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vgidFlattened->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)vgidFlattened,__position
                   ,(unsigned_short *)((long)puVar1 + lVar3));
      }
      else {
        *__position._M_current = *(unsigned_short *)((long)puVar1 + lVar3);
        (vgidFlattened->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      puVar1 = (this->m_vgidFlattened).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 2;
    } while (uVar2 < (ulong)((long)(this->m_vgidFlattened).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1));
  }
  return;
}

Assistant:

void GdlGlyphClassDefn::FlattenGlyphList(std::vector<utf16> & vgidFlattened)
{
	if (!m_fHasFlatList)
		FlattenMyGlyphList();
	for (size_t igid = 0; igid < m_vgidFlattened.size(); igid++)
	{
		vgidFlattened.push_back(m_vgidFlattened[igid]);
	}
}